

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSubscriptMat4x2(ShaderEvalContext *c)

{
  VecAccess<float,_4,_2> local_70;
  undefined1 local_60 [8];
  Vector<float,_2> local_58;
  undefined1 local_50 [8];
  Vector<float,_2> local_48;
  undefined1 local_40 [8];
  Vector<float,_2> local_38;
  undefined1 local_30 [8];
  Vector<float,_2> local_28;
  Vector<float,_2> local_20;
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)c,0);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)local_10,1);
  tcu::operator*((tcu *)&local_38,0.5,(Vector<float,_2> *)local_40);
  tcu::operator+((tcu *)&local_28,(Vector<float,_2> *)local_30,&local_38);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_50,(int)local_10,2);
  tcu::operator*((tcu *)&local_48,0.25,(Vector<float,_2> *)local_50);
  tcu::operator+((tcu *)&local_20,&local_28,&local_48);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_60,(int)local_10,3);
  tcu::operator*((tcu *)&local_58,0.125,(Vector<float,_2> *)local_60);
  tcu::operator+((tcu *)&local_18,&local_20,&local_58);
  local_70 = tcu::Vector<float,_4>::xy(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_70,&local_18);
  return;
}

Assistant:

void evalSubscriptMat4x2	(ShaderEvalContext& c) { c.color.xy()	= c.coords.swizzle(0,1) + 0.5f*c.coords.swizzle(1,2) + 0.25f*c.coords.swizzle(2,3) + 0.125f*c.coords.swizzle(3,0); }